

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O1

bool operator!=(Well<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_Detail::M3<28>,_Detail::M1,_Detail::M3<18>,_Detail::M3<3>,_Detail::M3<21>,_Detail::M3<_17>,_Detail::M3<_28>,_Detail::M3<_1>,_Detail::NoTempering>
                *lhs,Well<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_Detail::M3<28>,_Detail::M1,_Detail::M3<18>,_Detail::M3<3>,_Detail::M3<21>,_Detail::M3<_17>,_Detail::M3<_28>,_Detail::M3<_1>,_Detail::NoTempering>
                     *rhs)

{
  int *piVar1;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  sVar3 = lhs->index_;
  sVar4 = rhs->index_;
  bVar11 = true;
  if (lhs->state_[(uint)((int)(sVar3 + 0x2d6) + (int)((sVar3 + 0x2d6) / 0x2d6) * -0x2d6)] ==
      rhs->state_[(uint)((int)(sVar4 + 0x2d6) + (int)((sVar4 + 0x2d6) / 0x2d6) * -0x2d6)]) {
    uVar8 = sVar4 + 0x2d7;
    lVar7 = (long)&lhs->index_ + sVar3 * 4 + 4;
    uVar5 = sVar3 + 0x2d7;
    lVar10 = 0x2d5;
    lVar9 = (long)&rhs->index_ + sVar4 * 4 + 4;
    do {
      bVar11 = lVar10 != 0;
      lVar10 = lVar10 + -1;
      if (!bVar11) {
        return bVar11;
      }
      uVar6 = uVar8 / 0x2d6;
      piVar1 = (int *)(lVar7 + (uVar5 / 0x2d6) * -0xb58);
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 4;
      uVar5 = uVar5 + 1;
      piVar2 = (int *)(lVar9 + uVar6 * -0xb58);
      lVar9 = lVar9 + 4;
    } while (*piVar1 == *piVar2);
  }
  return bVar11;
}

Assistant:

bool operator!=(const Well& lhs, const Well& rhs)
    {
        return !(lhs == rhs);
    }